

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O0

size_type __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> v,size_type pos)

{
  basic_string_view<char,_std::char_traits<char>_> v_;
  not_in_view __pred;
  size_type sVar1;
  const_iterator pcVar2;
  char *pcVar3;
  size_type local_70;
  not_in_view local_48;
  const_pointer local_38;
  size_type sStack_30;
  size_type local_28;
  size_type pos_local;
  basic_string_view<char,_std::char_traits<char>_> *this_local;
  basic_string_view<char,_std::char_traits<char>_> v_local;
  
  v_local.data_ = (const_pointer)v.size_;
  this_local = (basic_string_view<char,_std::char_traits<char>_> *)v.data_;
  local_28 = pos;
  pos_local = (size_type)this;
  sVar1 = size(this);
  if (pos < sVar1) {
    pcVar2 = cbegin(this);
    pcVar3 = pcVar2 + local_28;
    pcVar2 = cend(this);
    v_.size_ = (size_type)v_local.data_;
    v_.data_ = (const_pointer)this_local;
    not_in_view::not_in_view(&local_48,v_);
    local_38 = local_48.v.data_;
    sStack_30 = local_48.v.size_;
    __pred.v.size_ = local_48.v.size_;
    __pred.v.data_ = local_48.v.data_;
    pcVar3 = std::
             find_if<char_const*,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::not_in_view>
                       (pcVar3,pcVar2,__pred);
    local_70 = to_pos(this,pcVar3);
  }
  else {
    local_70 = 0xffffffffffffffff;
  }
  return local_70;
}

Assistant:

nssv_constexpr size_type find_first_not_of( basic_string_view v, size_type pos = 0 ) const nssv_noexcept  // (1)
    {
        return pos >= size()
            ? npos
            : to_pos( std::find_if( cbegin() + pos, cend(), not_in_view( v ) ) );
    }